

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathEvalExpr(xmlXPathParserContextPtr ctxt)

{
  xmlXPathContextPtr pxVar1;
  xmlXPathCompExprPtr pxVar2;
  int iVar3;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  pxVar2 = xmlXPathTryStreamCompile(ctxt->context,ctxt->base);
  if (pxVar2 == (xmlXPathCompExprPtr)0x0) {
    if (ctxt->context == (xmlXPathContextPtr)0x0) {
      iVar3 = 0;
    }
    else {
      iVar3 = ctxt->context->depth;
    }
    xmlXPathCompileExpr(ctxt,1);
    pxVar1 = ctxt->context;
    if (pxVar1 != (xmlXPathContextPtr)0x0) {
      pxVar1->depth = iVar3;
    }
    if (ctxt->error != 0) {
      return;
    }
    if (*ctxt->cur != '\0') {
      xmlXPathErr(ctxt,7);
      return;
    }
    pxVar2 = ctxt->comp;
    if ((1 < pxVar2->nbStep) && (-1 < (long)pxVar2->last)) {
      if (pxVar1 != (xmlXPathContextPtr)0x0) {
        iVar3 = pxVar1->depth;
      }
      xmlXPathOptimizeExpression(ctxt,pxVar2->steps + pxVar2->last);
      if (ctxt->context != (xmlXPathContextPtr)0x0) {
        ctxt->context->depth = iVar3;
      }
    }
  }
  else {
    if (ctxt->comp != (xmlXPathCompExprPtr)0x0) {
      xmlXPathFreeCompExpr(ctxt->comp);
    }
    ctxt->comp = pxVar2;
  }
  xmlXPathRunEval(ctxt,0);
  return;
}

Assistant:

void
xmlXPathEvalExpr(xmlXPathParserContextPtr ctxt) {
#ifdef XPATH_STREAMING
    xmlXPathCompExprPtr comp;
#endif
    int oldDepth = 0;

    if (ctxt == NULL) return;

#ifdef XPATH_STREAMING
    comp = xmlXPathTryStreamCompile(ctxt->context, ctxt->base);
    if (comp != NULL) {
        if (ctxt->comp != NULL)
	    xmlXPathFreeCompExpr(ctxt->comp);
        ctxt->comp = comp;
    } else
#endif
    {
        if (ctxt->context != NULL)
            oldDepth = ctxt->context->depth;
	xmlXPathCompileExpr(ctxt, 1);
        if (ctxt->context != NULL)
            ctxt->context->depth = oldDepth;
        CHECK_ERROR;

        /* Check for trailing characters. */
        if (*ctxt->cur != 0)
            XP_ERROR(XPATH_EXPR_ERROR);

	if ((ctxt->comp->nbStep > 1) && (ctxt->comp->last >= 0)) {
            if (ctxt->context != NULL)
                oldDepth = ctxt->context->depth;
	    xmlXPathOptimizeExpression(ctxt,
		&ctxt->comp->steps[ctxt->comp->last]);
            if (ctxt->context != NULL)
                ctxt->context->depth = oldDepth;
        }
    }

    xmlXPathRunEval(ctxt, 0);
}